

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_flac__seek_forward_by_pcm_frames(ma_dr_flac *pFlac,ma_uint64 pcmFramesToSeek)

{
  ma_bool32 mVar1;
  ulong uVar2;
  ulong in_RSI;
  long in_RDI;
  ma_uint64 pcmFramesRead;
  ma_dr_flac *pFlac_00;
  ulong local_10;
  
  pFlac_00 = (ma_dr_flac *)0x0;
  local_10 = in_RSI;
  do {
    while( true ) {
      uVar2 = local_10;
      if (local_10 == 0) goto LAB_001ff225;
      if (*(int *)(in_RDI + 0x60) == 0) break;
      if (local_10 < *(uint *)(in_RDI + 0x60)) {
        *(int *)(in_RDI + 0x60) = *(int *)(in_RDI + 0x60) - (int)local_10;
        local_10 = 0;
      }
      else {
        uVar2 = (ulong)*(uint *)(in_RDI + 0x60);
        local_10 = local_10 - *(uint *)(in_RDI + 0x60);
        *(undefined4 *)(in_RDI + 0x60) = 0;
      }
      pFlac_00 = (ma_dr_flac *)((long)(pFlac_00->currentFLACFrame).subframes + (uVar2 - 0x68));
    }
    mVar1 = ma_dr_flac__read_and_decode_next_flac_frame(pFlac_00);
  } while (mVar1 != 0);
LAB_001ff225:
  *(long *)(in_RDI + 0xe8) =
       (long)(pFlac_00->currentFLACFrame).subframes + *(long *)(in_RDI + 0xe8) + -0x68;
  return (ma_uint64)pFlac_00;
}

Assistant:

static ma_uint64 ma_dr_flac__seek_forward_by_pcm_frames(ma_dr_flac* pFlac, ma_uint64 pcmFramesToSeek)
{
    ma_uint64 pcmFramesRead = 0;
    while (pcmFramesToSeek > 0) {
        if (pFlac->currentFLACFrame.pcmFramesRemaining == 0) {
            if (!ma_dr_flac__read_and_decode_next_flac_frame(pFlac)) {
                break;
            }
        } else {
            if (pFlac->currentFLACFrame.pcmFramesRemaining > pcmFramesToSeek) {
                pcmFramesRead   += pcmFramesToSeek;
                pFlac->currentFLACFrame.pcmFramesRemaining -= (ma_uint32)pcmFramesToSeek;
                pcmFramesToSeek  = 0;
            } else {
                pcmFramesRead   += pFlac->currentFLACFrame.pcmFramesRemaining;
                pcmFramesToSeek -= pFlac->currentFLACFrame.pcmFramesRemaining;
                pFlac->currentFLACFrame.pcmFramesRemaining = 0;
            }
        }
    }
    pFlac->currentPCMFrame += pcmFramesRead;
    return pcmFramesRead;
}